

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O2

void __thiscall
asio::detail::scoped_ptr<asio::io_context>::~scoped_ptr(scoped_ptr<asio::io_context> *this)

{
  io_context *this_00;
  
  this_00 = this->p_;
  if (this_00 != (io_context *)0x0) {
    execution_context::~execution_context(&this_00->super_execution_context);
  }
  operator_delete(this_00);
  return;
}

Assistant:

~scoped_ptr()
  {
    delete p_;
  }